

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::ConditionalJumpPattern::TryToGenerateCode
          (ConditionalJumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  TLogicOperator TVar1;
  CJumpConditionalStatement *this_00;
  CExpression *pCVar2;
  CTempExpression *this_01;
  CTempExpression *this_02;
  CLabelStatement *pCVar3;
  bool bVar4;
  CTemp rightOperand;
  CTemp leftOperand;
  undefined1 auStack_c8 [16];
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_b8;
  pair<IRT::CTemp,_const_IRT::INode_*> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (tree == (INode *)0x0) {
    bVar4 = false;
  }
  else {
    bVar4 = false;
    this_00 = (CJumpConditionalStatement *)
              __dynamic_cast(tree,&INode::typeinfo,&CJumpConditionalStatement::typeinfo,0);
    if (this_00 != (CJumpConditionalStatement *)0x0) {
      CTemp::CTemp((CTemp *)&local_48);
      CTemp::CTemp((CTemp *)&local_68);
      pCVar2 = CJumpConditionalStatement::LeftOperand(this_00);
      if (pCVar2 == (CExpression *)0x0) {
        this_01 = (CTempExpression *)0x0;
      }
      else {
        this_01 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      pCVar2 = CJumpConditionalStatement::RightOperand(this_00);
      if (pCVar2 == (CExpression *)0x0) {
        this_02 = (CTempExpression *)0x0;
      }
      else {
        this_02 = (CTempExpression *)
                  __dynamic_cast(pCVar2,&CExpression::typeinfo,&CTempExpression::typeinfo,0);
      }
      if (this_01 == (CTempExpression *)0x0) {
        pCVar2 = CJumpConditionalStatement::LeftOperand(this_00);
        std::__cxx11::string::string((string *)(auStack_c8 + 0x10),(string *)&local_48);
        local_b8.second = pCVar2;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_90,(pair<IRT::CTemp,_const_IRT::CExpression_*> *)(auStack_c8 + 0x10));
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)(auStack_c8 + 0x10));
      }
      else {
        CTempExpression::getTemprorary(this_01);
        std::__cxx11::string::_M_assign((string *)&local_48);
      }
      if (this_02 == (CTempExpression *)0x0) {
        pCVar2 = CJumpConditionalStatement::RightOperand(this_00);
        std::__cxx11::string::string((string *)(auStack_c8 + 0x10),(string *)&local_68);
        local_b8.second = pCVar2;
        std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                  (&local_90,(pair<IRT::CTemp,_const_IRT::CExpression_*> *)(auStack_c8 + 0x10));
        std::
        vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
        ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                  ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                    *)children,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)(auStack_c8 + 0x10));
      }
      else {
        CTempExpression::getTemprorary(this_02);
        std::__cxx11::string::_M_assign((string *)&local_68);
      }
      TVar1 = CJumpConditionalStatement::Operation(this_00);
      switch(TVar1) {
      case EQUALS:
        pCVar3 = CJumpConditionalStatement::TrueLabel(this_00);
        CLabelStatement::Label((CLabel *)(auStack_c8 + 0x10),pCVar3);
        CLabel::ToString_abi_cxx11_((string *)&local_90,(CLabel *)(auStack_c8 + 0x10));
        std::
        make_shared<AssemblyCode::CJumpEqualCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                  ((CTemp *)auStack_c8,(CTemp *)&local_48,&local_68);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::CJumpEqualCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::CJumpEqualCommand> *)auStack_c8);
        break;
      case NOT_EQUALS:
        pCVar3 = CJumpConditionalStatement::TrueLabel(this_00);
        CLabelStatement::Label((CLabel *)(auStack_c8 + 0x10),pCVar3);
        CLabel::ToString_abi_cxx11_((string *)&local_90,(CLabel *)(auStack_c8 + 0x10));
        std::
        make_shared<AssemblyCode::CJumpNotEqualCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                  ((CTemp *)auStack_c8,(CTemp *)&local_48,&local_68);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::CJumpNotEqualCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::CJumpNotEqualCommand> *)auStack_c8);
        break;
      case LESS:
        pCVar3 = CJumpConditionalStatement::TrueLabel(this_00);
        CLabelStatement::Label((CLabel *)(auStack_c8 + 0x10),pCVar3);
        CLabel::ToString_abi_cxx11_((string *)&local_90,(CLabel *)(auStack_c8 + 0x10));
        std::
        make_shared<AssemblyCode::CJumpLessCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                  ((CTemp *)auStack_c8,(CTemp *)&local_48,&local_68);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)auStack_c8);
        break;
      case GREATER:
        pCVar3 = CJumpConditionalStatement::TrueLabel(this_00);
        CLabelStatement::Label((CLabel *)(auStack_c8 + 0x10),pCVar3);
        CLabel::ToString_abi_cxx11_((string *)&local_90,(CLabel *)(auStack_c8 + 0x10));
        std::
        make_shared<AssemblyCode::CJumpLessCommand,IRT::CTemp&,IRT::CTemp&,std::__cxx11::string>
                  ((CTemp *)auStack_c8,(CTemp *)&local_68,&local_48);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
        ::emplace_back<std::shared_ptr<AssemblyCode::CJumpLessCommand>>
                  ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                    *)commands,(shared_ptr<AssemblyCode::CJumpLessCommand> *)auStack_c8);
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/TreePatterns.cpp"
                      ,0x146,
                      "virtual bool IRT::ConditionalJumpPattern::TryToGenerateCode(const IRT::INode *, const IRT::CTemp &, ChildrenTemps &, AssemblyCommands &)"
                     );
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(auStack_c8 + 8));
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)(auStack_c8 + 0x10));
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
      bVar4 = true;
    }
  }
  return bVar4;
}

Assistant:

bool
IRT::ConditionalJumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                                AssemblyCommands &commands ) {
    ConstCJumpPtr cJumpPtr = dynamic_cast<ConstCJumpPtr>(tree);
    if ( cJumpPtr ) {
        CTemp leftOperand;
        CTemp rightOperand;
        ConstTempPtr leftTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->LeftOperand( ));
        ConstTempPtr rightTemp = dynamic_cast<ConstTempPtr>(cJumpPtr->RightOperand( ));
        if ( !leftTemp ) {
            children.push_back( std::make_pair( leftOperand, cJumpPtr->LeftOperand( )));
        } else {
            leftOperand = leftTemp->getTemprorary( );
        }
        if ( !rightTemp ) {
            children.push_back( std::make_pair( rightOperand, cJumpPtr->RightOperand( )));
        } else {
            rightOperand = rightTemp->getTemprorary( );
        }
        switch ( cJumpPtr->Operation( )) {
            case IRT::enums::TLogicOperator::LESS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( leftOperand, rightOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::GREATER : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpLessCommand>( rightOperand, leftOperand,
                                                                                         cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpEqualCommand>( leftOperand, rightOperand,
                                                                                          cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            case IRT::enums::TLogicOperator::NOT_EQUALS : {
                commands.emplace_back( std::make_shared<AssemblyCode::CJumpNotEqualCommand>( leftOperand, rightOperand,
                                                                                             cJumpPtr->TrueLabel( )->Label( ).ToString( )));
                break;
            }
            default: {
                assert( false );
            }
        }
        return true;
    }
    return false;
}